

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dleq_impl.h
# Opt level: O0

int secp256k1_dleq_deserialize_point(secp256k1_ge *p,uchar *buf33)

{
  int iVar1;
  undefined1 local_48 [8];
  secp256k1_fe x;
  uchar *buf33_local;
  secp256k1_ge *p_local;
  
  x.n[4] = (uint64_t)buf33;
  iVar1 = secp256k1_fe_set_b32((secp256k1_fe *)local_48,buf33 + 1);
  if (iVar1 == 0) {
    p_local._4_4_ = 0;
  }
  else if (*(byte *)x.n[4] < 2) {
    secp256k1_ge_set_xo_var(p,(secp256k1_fe *)local_48,(uint)*(byte *)x.n[4]);
    p_local._4_4_ = 1;
  }
  else {
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

static int secp256k1_dleq_deserialize_point(secp256k1_ge *p, const unsigned char *buf33) {
    secp256k1_fe x;

    if (!secp256k1_fe_set_b32(&x, &buf33[1])) {
        return 0;
    }
    if (buf33[0] > 1) {
        return 0;
    }
    secp256k1_ge_set_xo_var(p, &x, buf33[0]);
    return 1;
}